

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::Seek(Iter *this,Slice *target)

{
  bool bVar1;
  int iVar2;
  Slice local_60;
  undefined1 local_50 [8];
  Slice mid_key;
  char *key_ptr;
  uint local_30;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  uint32_t region_offset;
  uint32_t mid;
  uint32_t right;
  uint32_t left;
  Slice *target_local;
  Iter *this_local;
  
  mid = 0;
  region_offset = this->num_restarts_ - 1;
  _right = target;
  target_local = (Slice *)this;
  while( true ) {
    if (region_offset <= mid) {
      SeekToRestartPoint(this,mid);
      do {
        bVar1 = ParseNextKey(this);
        if (!bVar1) {
          return;
        }
        Slice::Slice(&local_60,&this->key_);
        iVar2 = Compare(this,&local_60,_right);
      } while (iVar2 < 0);
      return;
    }
    shared = mid + region_offset + 1 >> 1;
    non_shared = GetRestartPoint(this,shared);
    mid_key.size_ =
         (size_t)DecodeEntry(this->data_ + non_shared,this->data_ + this->restarts_,&value_length,
                             &local_30,(uint32_t *)((long)&key_ptr + 4));
    if (((char *)mid_key.size_ == (char *)0x0) || (value_length != 0)) break;
    Slice::Slice((Slice *)local_50,(char *)mid_key.size_,(ulong)local_30);
    iVar2 = Compare(this,(Slice *)local_50,_right);
    if (iVar2 < 0) {
      mid = shared;
    }
    else {
      region_offset = shared - 1;
    }
  }
  CorruptionError(this);
  return;
}

Assistant:

void Seek(const Slice& target) override {
    // Binary search in restart array to find the last restart point
    // with a key < target
    uint32_t left = 0;
    uint32_t right = num_restarts_ - 1;
    while (left < right) {
      uint32_t mid = (left + right + 1) / 2;
      uint32_t region_offset = GetRestartPoint(mid);
      uint32_t shared, non_shared, value_length;
      const char* key_ptr =
          DecodeEntry(data_ + region_offset, data_ + restarts_, &shared,
                      &non_shared, &value_length);
      if (key_ptr == nullptr || (shared != 0)) {
        CorruptionError();
        return;
      }
      Slice mid_key(key_ptr, non_shared);
      if (Compare(mid_key, target) < 0) {
        // Key at "mid" is smaller than "target".  Therefore all
        // blocks before "mid" are uninteresting.
        left = mid;
      } else {
        // Key at "mid" is >= "target".  Therefore all blocks at or
        // after "mid" are uninteresting.
        right = mid - 1;
      }
    }

    // Linear search (within restart block) for first key >= target
    SeekToRestartPoint(left);
    while (true) {
      if (!ParseNextKey()) {
        return;
      }
      if (Compare(key_, target) >= 0) {
        return;
      }
    }
  }